

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  pointer pMVar3;
  pointer pMVar4;
  StringRef text;
  StringRef text_00;
  char *pcVar5;
  SourceLineInfo *pSVar6;
  _Alloc_hider this_00;
  int iVar7;
  byte bVar8;
  XmlFormatting fmt;
  XmlWriter *pXVar9;
  SourceLineInfo *sourceInfo;
  bool bVar10;
  StringRef name;
  StringRef name_00;
  StringRef attribute;
  ScopedElement t;
  string local_90;
  XmlReporter *local_70;
  string local_68;
  _Alloc_hider local_48;
  XmlWriter *local_40;
  
  local_70 = this;
  iVar7 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  bVar8 = 1;
  if ((char)iVar7 == '\0') {
    bVar8 = ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  local_48._M_p = (pointer)assertionStats;
  if ((bVar8 != 0) || ((assertionStats->assertionResult).m_resultData.resultType == Warning)) {
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar3 != pMVar4) {
      pXVar9 = &local_70->m_xml;
      sourceInfo = &pMVar3->lineInfo;
      do {
        fmt = (XmlFormatting)&local_90;
        if (*(int *)&sourceInfo[1].file == 1 && bVar8 == 1) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Info","");
          XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)pXVar9,fmt);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          writeSourceInfo(local_70,sourceInfo);
          XmlWriter::writeText
                    ((XmlWriter *)local_68._M_dataplus._M_p,(StringRef)sourceInfo[-2],Newline|Indent
                    );
LAB_0014365b:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
        }
        else if (*(int *)&sourceInfo[1].file == 2) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Warning","");
          XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)pXVar9,fmt);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          writeSourceInfo(local_70,sourceInfo);
          XmlWriter::writeText
                    ((XmlWriter *)local_68._M_dataplus._M_p,(StringRef)sourceInfo[-2],Newline|Indent
                    );
          goto LAB_0014365b;
        }
        pSVar6 = sourceInfo + 1;
        sourceInfo = (SourceLineInfo *)&sourceInfo[4].line;
      } while ((pointer)&pSVar6->line != pMVar4);
    }
  }
  this_00._M_p = local_48._M_p;
  if (((bVar8 == 0) && (*(OfType *)(local_48._M_p + 0x88) != ExplicitSkip)) &&
     (*(OfType *)(local_48._M_p + 0x88) != Warning)) {
    return;
  }
  if (*(size_type *)(local_48._M_p + 0x28) != 0) {
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Expression","");
    pXVar9 = &local_70->m_xml;
    XmlWriter::startElement(pXVar9,&local_90,Newline|Indent);
    bVar10 = (*(OfType *)(this_00._M_p + 0x88) & FailureBit) == Ok;
    pcVar5 = "hello.value() == false";
    if (bVar10) {
      pcVar5 = "world.value() == true";
    }
    attribute.m_start = pcVar5 + 0x11;
    attribute.m_size = (ulong)bVar10 ^ 5;
    name.m_size = 7;
    name.m_start = "success";
    XmlWriter::writeAttribute(pXVar9,name,attribute);
    name_00.m_size = 4;
    name_00.m_start = "type";
    XmlWriter::writeAttribute(pXVar9,name_00,*(StringRef *)this_00._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = ((SourceLineInfo *)(this_00._M_p + 0x10))->file;
    local_90._M_string_length = *(size_type *)(this_00._M_p + 0x18);
    writeSourceInfo(local_70,(SourceLineInfo *)&local_90);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Original","");
    XmlWriter::scopedElement
              ((XmlWriter *)&stack0xffffffffffffffc0,(string *)pXVar9,(XmlFormatting)&local_90);
    AssertionResult::getExpression_abi_cxx11_(&local_68,(AssertionResult *)this_00._M_p);
    text.m_size = local_68._M_string_length;
    text.m_start = local_68._M_dataplus._M_p;
    XmlWriter::writeText(local_40,text,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Expanded","");
    XmlWriter::scopedElement
              ((XmlWriter *)&stack0xffffffffffffffc0,(string *)pXVar9,(XmlFormatting)&local_90);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_68,(AssertionResult *)this_00._M_p);
    text_00.m_size = local_68._M_string_length;
    text_00.m_start = local_68._M_dataplus._M_p;
    XmlWriter::writeText(local_40,text_00,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  OVar2 = *(OfType *)(this_00._M_p + 0x88);
  if (OVar2 < ExplicitFailure) {
    if (OVar2 == Info) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Info","");
      XmlWriter::scopedElement
                ((XmlWriter *)&local_68,(string *)&local_70->m_xml,(XmlFormatting)&local_90);
      XmlWriter::writeText
                ((XmlWriter *)local_68._M_dataplus._M_p,*(StringRef *)(this_00._M_p + 0x38),
                 Newline|Indent);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00143a23;
    }
    if (OVar2 != ExplicitSkip) goto LAB_00143a23;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Skip","");
    pXVar9 = &local_70->m_xml;
    XmlWriter::startElement(pXVar9,&local_90,Newline|Indent);
  }
  else if (OVar2 == ExplicitFailure) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Failure","");
    pXVar9 = &local_70->m_xml;
    XmlWriter::startElement(pXVar9,&local_90,Newline|Indent);
  }
  else if (OVar2 == FatalErrorCondition) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"FatalErrorCondition","");
    pXVar9 = &local_70->m_xml;
    XmlWriter::startElement(pXVar9,&local_90,Newline|Indent);
  }
  else {
    if (OVar2 != ThrewException) goto LAB_00143a23;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Exception","");
    pXVar9 = &local_70->m_xml;
    XmlWriter::startElement(pXVar9,&local_90,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = ((SourceLineInfo *)(this_00._M_p + 0x10))->file;
  local_90._M_string_length = *(size_type *)(this_00._M_p + 0x18);
  writeSourceInfo(local_70,(SourceLineInfo *)&local_90);
  XmlWriter::writeText(pXVar9,*(StringRef *)(this_00._M_p + 0x38),Newline|Indent);
  XmlWriter::endElement(pXVar9,Newline|Indent);
LAB_00143a23:
  if (*(size_type *)(this_00._M_p + 0x28) != 0) {
    XmlWriter::endElement(&local_70->m_xml,Newline|Indent);
  }
  return;
}

Assistant:

void XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    auto t = m_xml.scopedElement( "Info" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    auto t = m_xml.scopedElement( "Warning" );
                    writeSourceInfo( msg.lineInfo );
                    t.writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if ( !includeResults && result.getResultType() != ResultWas::Warning &&
             result.getResultType() != ResultWas::ExplicitSkip ) {
            return;
        }

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success"_sr, result.succeeded() )
                .writeAttribute( "type"_sr, result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                     .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::ExplicitSkip:
                m_xml.startElement( "Skip" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();
    }